

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

bool __thiscall
CodeGenGenericContext::IsLastRegVmRegisterUse
          (CodeGenGenericContext *this,uchar regId,uchar *instRegKillInfo)

{
  byte bVar1;
  uint local_3c;
  uint local_38;
  uint k_1;
  uint k;
  uint postKillCount;
  uint preKillCount;
  uint regKillCounts;
  uchar *instRegKillInfo_local;
  uchar regId_local;
  CodeGenGenericContext *this_local;
  
  bVar1 = *instRegKillInfo;
  if (bVar1 != 0) {
    _preKillCount = instRegKillInfo + 1;
    for (local_38 = 0; local_38 < bVar1 >> 4; local_38 = local_38 + 1) {
      if (regId == *_preKillCount) {
        return true;
      }
      _preKillCount = _preKillCount + 1;
    }
    for (local_3c = 0; local_3c < (bVar1 & 0xf); local_3c = local_3c + 1) {
      if (regId == *_preKillCount) {
        return true;
      }
      _preKillCount = _preKillCount + 1;
    }
  }
  return false;
}

Assistant:

bool CodeGenGenericContext::IsLastRegVmRegisterUse(unsigned char regId, unsigned char *instRegKillInfo)
{
	if(unsigned regKillCounts = *instRegKillInfo)
	{
		instRegKillInfo++;

		unsigned preKillCount = (regKillCounts >> 4);
		unsigned postKillCount = (regKillCounts & 0xf);

		for(unsigned k = 0; k < preKillCount; k++)
		{
			if(regId == *instRegKillInfo++)
				return true;
		}

		for(unsigned k = 0; k < postKillCount; k++)
		{
			if(regId == *instRegKillInfo++)
				return true;
		}
	}

	return false;
}